

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::JsonReporter::listListeners
          (JsonReporter *this,
          vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
          *descriptions)

{
  pointer pLVar1;
  StringRef value;
  int __fd;
  _Elt_pointer pJVar2;
  pointer pLVar3;
  StringRef key;
  JsonArrayWriter writer;
  JsonObjectWriter desc_writer;
  JsonArrayWriter local_1f8;
  JsonObjectWriter local_1e0;
  undefined1 local_1c8 [400];
  uint64_t local_38;
  
  if (this->m_startedListing == false) {
    key.m_size = 8;
    key.m_start = "listings";
    startObject(this,key);
  }
  this->m_startedListing = true;
  pJVar2 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar2 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar2 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)local_1c8,(int)pJVar2 + -0x18,"listeners",9);
  local_1f8.m_os = (ostream *)local_1c8._0_8_;
  local_1f8.m_indent_level = local_38;
  local_1f8.m_should_comma = false;
  local_1f8.m_active = true;
  local_1e0.m_os._0_1_ = 0x5b;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8._0_8_,(char *)&local_1e0,1);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x88));
  pLVar3 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar3 != pLVar1) {
    do {
      JsonArrayWriter::writeObject(&local_1e0,&local_1f8);
      __fd = (int)&local_1e0;
      JsonObjectWriter::write((JsonObjectWriter *)local_1c8,__fd,"name",4);
      JsonValueWriter::writeImpl((JsonValueWriter *)local_1c8,pLVar3->name,true);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
      std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x88));
      JsonObjectWriter::write((JsonObjectWriter *)local_1c8,__fd,"description",0xb);
      value.m_start = (pLVar3->description)._M_dataplus._M_p;
      value.m_size = (pLVar3->description)._M_string_length;
      JsonValueWriter::writeImpl((JsonValueWriter *)local_1c8,value,true);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
      std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x88));
      JsonObjectWriter::~JsonObjectWriter(&local_1e0);
      pLVar3 = pLVar3 + 1;
    } while (pLVar3 != pLVar1);
  }
  JsonArrayWriter::~JsonArrayWriter(&local_1f8);
  return;
}

Assistant:

void JsonReporter::listListeners(
        std::vector<ListenerDescription> const& descriptions ) {
        startListing();

        auto writer =
            m_objectWriters.top().write( "listeners"_sr ).writeArray();

        for ( auto const& desc : descriptions ) {
            auto desc_writer = writer.writeObject();
            desc_writer.write( "name"_sr ).write( desc.name );
            desc_writer.write( "description"_sr ).write( desc.description );
        }
    }